

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemParse.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  int iVar1;
  SAXParser *this;
  MemBufInputSource *this_00;
  ostream *poVar2;
  char *pcVar3;
  ErrorHandler *pEVar4;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  MemParseHandlers handler;
  
  pcVar3 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  lVar7 = 1;
  while( true ) {
    if (argC <= lVar7) {
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar3);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      bVar5 = SUB81(this,0);
      xercesc_4_0::SAXParser::setDoNamespaces(bVar5);
      xercesc_4_0::SAXParser::setDoSchema(bVar5);
      xercesc_4_0::SAXParser::setHandleMultipleImports(bVar5);
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar5);
      MemParseHandlers::MemParseHandlers(&handler);
      (**(code **)(*(long *)this + 0x20))(this,&handler.super_HandlerBase.super_DocumentHandler);
      pEVar4 = &handler.super_HandlerBase.super_ErrorHandler;
      (**(code **)(*(long *)this + 0x28))(this);
      this_00 = (MemBufInputSource *)
                xercesc_4_0::XMemory::operator_new((XMemory *)0x48,(ulong)pEVar4);
      xercesc_4_0::MemBufInputSource::MemBufInputSource
                (this_00,(uchar *)
                         "<?xml version=\'1.0\' encoding=\'ascii\'?>\n<!DOCTYPE company [\n<!ELEMENT company     (product,category,developedAt)>\n<!ELEMENT product     (#PCDATA)>\n<!ELEMENT category    (#PCDATA)>\n<!ATTLIST category idea CDATA #IMPLIED>\n<!ELEMENT developedAt (#PCDATA)>\n]>\n\n<company>\n    <product>XML4C</product>\n    <category idea=\'great\'>XML Parsing Tools</category>\n    <developedAt>\n      IBM Center for Java Technology, Silicon Valley, Cupertino, CA\n    </developedAt>\n</company>"
                 ,0x1d2,"prodInfo",false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*(long *)this + 0x30))(this,this_00);
      xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      iVar1 = xercesc_4_0::SAXParser::getErrorCount();
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "\nFinished parsing the memory buffer containing the following ");
        poVar2 = std::operator<<(poVar2,"XML statements:\n\n");
        poVar2 = std::operator<<(poVar2,
                                 "<?xml version=\'1.0\' encoding=\'ascii\'?>\n<!DOCTYPE company [\n<!ELEMENT company     (product,category,developedAt)>\n<!ELEMENT product     (#PCDATA)>\n<!ELEMENT category    (#PCDATA)>\n<!ATTLIST category idea CDATA #IMPLIED>\n<!ELEMENT developedAt (#PCDATA)>\n]>\n\n<company>\n    <product>XML4C</product>\n    <category idea=\'great\'>XML Parsing Tools</category>\n    <developedAt>\n      IBM Center for Java Technology, Silicon Valley, Cupertino, CA\n    </developedAt>\n</company>"
                                );
        poVar2 = std::operator<<(poVar2,"\n\n\n");
        poVar2 = std::operator<<(poVar2,"Parsing took ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," ms (");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," elements, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," attributes, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," spaces, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," characters).\n");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      (**(code **)(*(long *)this + 8))(this);
      (**(code **)(*(long *)this_00 + 8))(this_00);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      MemParseHandlers::~MemParseHandlers(&handler);
      return (uint)(0 < iVar1) << 2;
    }
    pcVar6 = argV[lVar7];
    if ((*pcVar6 != '-') || ((pcVar6[1] == '?' && (pcVar6[2] == '\0')))) break;
    if (((pcVar6[1] == 'v') && (pcVar6[2] == '=')) || ((pcVar6[1] == 'V' && (pcVar6[2] == '=')))) {
      pcVar6 = pcVar6 + 3;
      pcVar3 = "never";
      iVar1 = strcmp(pcVar6,"never");
      if (iVar1 != 0) {
        pcVar3 = "auto";
        iVar1 = strcmp(pcVar6,"auto");
        if (iVar1 != 0) {
          pcVar3 = "always";
          iVar1 = strcmp(pcVar6,"always");
          if (iVar1 != 0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
            poVar2 = std::operator<<(poVar2,pcVar6);
            std::endl<char,std::char_traits<char>>(poVar2);
            return 2;
          }
        }
      }
    }
    else if ((((pcVar6[1] != 'n') || (pcVar6[2] != '\0')) &&
             (((pcVar6[1] != 'N' || (pcVar6[2] != '\0')) &&
              ((pcVar6[1] != 's' || (pcVar6[2] != '\0')))))) &&
            (((pcVar6[1] != 'S' || (pcVar6[2] != '\0')) &&
             (((pcVar6[1] != 'f' || (pcVar6[2] != '\0')) &&
              ((pcVar6[1] != 'F' || (pcVar6[2] != '\0')))))))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
      poVar2 = std::operator<<(poVar2,argV[lVar7]);
      pcVar3 = "\', ignoring it\n";
      poVar2 = std::operator<<(poVar2,"\', ignoring it\n");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    lVar7 = lVar7 + 1;
  }
  usage();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C2 system
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool doNamespaces       = false;
    bool doSchema           = false;
    bool schemaFullChecking = false;

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handlers.
    //
    MemParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    //
    //  Create MemBufferInputSource from the buffer containing the XML
    //  statements.
    //
    //  NOTE: We are using strlen() here, since we know that the chars in
    //  our hard coded buffer are single byte chars!!! The parameter wants
    //  the number of BYTES, not chars, so when you create a memory buffer
    //  give it the byte size (which just happens to be the same here.)
    //
    MemBufInputSource* memBufIS = new MemBufInputSource
    (
        (const XMLByte*)gXMLInMemBuf
        , strlen(gXMLInMemBuf)
        , gMemBufId
        , false
    );

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;
    int errorCount = 0;
    int errorCode = 0;
    try
    {
        const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
        parser->parse(*memBufIS);
        const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
        duration = endMillis - startMillis;
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing memory stream:\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    // Print out the stats that we collected and time taken.
    if (!errorCount) {
        std::cout << "\nFinished parsing the memory buffer containing the following "
             << "XML statements:\n\n"
             << gXMLInMemBuf
             << "\n\n\n"
             << "Parsing took " << duration << " ms ("
             << handler.getElementCount() << " elements, "
             << handler.getAttrCount() << " attributes, "
             << handler.getSpaceCount() << " spaces, "
             << handler.getCharacterCount() << " characters).\n" << std::endl;
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    delete memBufIS;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}